

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O2

ostream * __thiscall
wasm::ValidationInfo::fail<wasm::DataDrop*,std::__cxx11::string>
          (ValidationInfo *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *text,DataDrop *curr,
          Function *func)

{
  ostringstream *poVar1;
  ostream *poVar2;
  ostream *poVar3;
  
  LOCK();
  (this->valid)._M_base._M_i = false;
  UNLOCK();
  poVar1 = getStream_abi_cxx11_(this,func);
  if (this->quiet != false) {
    return (ostream *)poVar1;
  }
  poVar2 = printFailureHeader(this,func);
  poVar3 = std::operator<<(poVar2,(string *)text);
  std::operator<<(poVar3,", on \n");
  poVar2 = printModuleComponent((Expression *)curr,poVar2,this->wasm);
  return poVar2;
}

Assistant:

std::ostream& fail(S text, T curr, Function* func) {
    valid.store(false);
    auto& stream = getStream(func);
    if (quiet) {
      return stream;
    }
    auto& ret = printFailureHeader(func);
    ret << text << ", on \n";
    return printModuleComponent(curr, ret, wasm);
  }